

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

btScalar AreaOf(btVector3 *x0,btVector3 *x1,btVector3 *x2)

{
  btScalar bVar1;
  btVector3 cr;
  btVector3 b;
  btVector3 a;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 local_28;
  
  local_28 = operator-(x1,x0);
  local_38 = operator-(x2,x0);
  local_48 = btVector3::cross(&local_28,&local_38);
  bVar1 = btVector3::length(&local_48);
  return bVar1;
}

Assistant:

static inline btScalar			AreaOf(		const btVector3& x0,
									   const btVector3& x1,
									   const btVector3& x2)
{
	const btVector3	a=x1-x0;
	const btVector3	b=x2-x0;
	const btVector3	cr=btCross(a,b);
	const btScalar	area=cr.length();
	return(area);
}